

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_93521a::HandleVersionMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string version_max;
  string version_min;
  string local_c8;
  string local_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  string local_40;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if (uVar4 < 0x21) {
    local_88.first._M_len = (size_t)&local_88.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"VERSION not given an argument","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a53ba:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_88.first._M_len
        != &local_88.second) {
      operator_delete((void *)local_88.first._M_len,
                      (ulong)((long)&((local_88.second)->_M_dataplus)._M_p + 1));
    }
    return false;
  }
  if (uVar4 != 0x40) {
    local_88.first._M_len = (size_t)&local_88.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"VERSION given too many arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_002a53ba;
  }
  pbVar1 = pbVar2 + 1;
  lVar5 = std::__cxx11::string::find((char *)pbVar1,0x83a12d,0);
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)pbVar1);
  if (lVar5 == -1) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)pbVar1);
    if ((local_a8._M_string_length == 0) || (local_c8._M_string_length == 0)) {
      local_88.first._M_len = 9;
      local_88.first._M_str = "VERSION \"";
      local_88.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_68 = pbVar2[1]._M_dataplus._M_p;
      local_70 = pbVar2[1]._M_string_length;
      local_60 = 0;
      local_58 = 0x31;
      local_50 = "\" does not have a version on both sides of \"...\".";
      local_48 = 0;
      views._M_len = 3;
      views._M_array = &local_88;
      cmCatViews(&local_40,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
      goto LAB_002a54b8;
    }
  }
  bVar3 = cmMakefile::SetPolicyVersion(status->Makefile,&local_a8,&local_c8);
LAB_002a54b8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    return bVar3;
  }
  operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  return bVar3;
}

Assistant:

bool HandleVersionMode(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() <= 1) {
    status.SetError("VERSION not given an argument");
    return false;
  }
  if (args.size() >= 3) {
    status.SetError("VERSION given too many arguments");
    return false;
  }
  std::string const& version_string = args[1];

  // Separate the <min> version and any trailing ...<max> component.
  std::string::size_type const dd = version_string.find("...");
  std::string const version_min = version_string.substr(0, dd);
  std::string const version_max = dd != std::string::npos
    ? version_string.substr(dd + 3, std::string::npos)
    : std::string();
  if (dd != std::string::npos &&
      (version_min.empty() || version_max.empty())) {
    status.SetError(
      cmStrCat("VERSION \"", version_string,
               R"(" does not have a version on both sides of "...".)"));
    return false;
  }

  return status.GetMakefile().SetPolicyVersion(version_min, version_max);
}